

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O2

void signalHandler(int sigNum)

{
  qpCrashHandler *pqVar1;
  long lVar2;
  char *pcVar3;
  qpCrashType qVar4;
  long lVar5;
  
  pqVar1 = g_crashHandler;
  pcVar3 = "Unknown signal";
  qVar4 = QP_CRASHTYPE_OTHER;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 + 0x10 == 0x70) goto LAB_007e363a;
    lVar2 = lVar5 + 0x10;
  } while (*(int *)((long)&s_signals[0].signalNum + lVar5) != sigNum);
  qVar4 = *(qpCrashType *)((long)&s_signals[0].type + lVar5);
  pcVar3 = *(char **)((long)&s_signals[0].name + lVar5);
LAB_007e363a:
  (g_crashHandler->crashInfo).type = qVar4;
  (pqVar1->crashInfo).message = pcVar3;
  (pqVar1->crashInfo).file = (char *)0x0;
  (pqVar1->crashInfo).line = 0;
  if (pqVar1->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*pqVar1->crashHandlerFunc)(pqVar1,pqVar1->handlerUserPointer);
    return;
  }
  return;
}

Assistant:

static void signalHandler (int sigNum)
{
	const SignalInfo*	info	= getSignalInfo(sigNum);
	qpCrashType			type	= info ? info->type : QP_CRASHTYPE_OTHER;
	const char*			name	= info ? info->name : "Unknown signal";

	qpCrashInfo_set(&g_crashHandler->crashInfo, type, name, DE_NULL, 0);

	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}